

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapParse.c
# Opt level: O0

void Amap_LibParseTest(char *pFileName)

{
  abctime aVar1;
  Amap_Lib_t *p_00;
  abctime aVar2;
  abctime clk;
  Amap_Lib_t *p;
  int fVerbose;
  char *pFileName_local;
  
  aVar1 = Abc_Clock();
  p_00 = Amap_LibReadFile(pFileName,0);
  if (p_00 != (Amap_Lib_t *)0x0) {
    Amap_LibParseEquations(p_00,0);
    Amap_LibFree(p_00);
    Abc_Print(1,"%s =","Total time");
    aVar2 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar2 - aVar1) * 1.0) / 1000000.0);
  }
  return;
}

Assistant:

void Amap_LibParseTest( char * pFileName )
{
    int fVerbose = 0;
    Amap_Lib_t * p;
    abctime clk = Abc_Clock();
    p = Amap_LibReadFile( pFileName, fVerbose );
    if ( p == NULL )
        return;
    Amap_LibParseEquations( p, fVerbose );
    Amap_LibFree( p );
    ABC_PRT( "Total time", Abc_Clock() - clk );
}